

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O1

void __thiscall chrono::fea::ChElementHexaCorot_20::ComputeNF(ChElementHexaCorot_20 *this)

{
  ChVectorDynamic<> *in_RCX;
  double *in_RDX;
  ChVectorDynamic<> *in_RSI;
  ChVectorDynamic<> *in_R8;
  ChVectorDynamic<> *in_R9;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  ComputeNF((ChElementHexaCorot_20 *)
            ((long)this[-1].super_ChElementCorotational.A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 0x20),in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
  return;
}

Assistant:

void ChElementHexaCorot_20::ComputeNF(const double U,
                                      const double V,
                                      const double W,
                                      ChVectorDynamic<>& Qi,
                                      double& detJ,
                                      const ChVectorDynamic<>& F,
                                      ChVectorDynamic<>* state_x,
                                      ChVectorDynamic<>* state_w) {
    // evaluate shape functions (in compressed vector), btw. not dependant on state
    ShapeVector N;
    ShapeFunctions(N, U, V, W);  // note: U,V,W in -1..1 range

    detJ = this->GetVolume() / 8.0;

    Qi(0) = N(0) * F(0);
    Qi(1) = N(0) * F(1);
    Qi(2) = N(0) * F(2);
    Qi(3) = N(1) * F(0);
    Qi(4) = N(1) * F(1);
    Qi(5) = N(1) * F(2);
    Qi(6) = N(2) * F(0);
    Qi(7) = N(2) * F(1);
    Qi(8) = N(2) * F(2);
    Qi(9) = N(3) * F(0);
    Qi(10) = N(3) * F(1);
    Qi(11) = N(3) * F(2);
    Qi(12) = N(4) * F(0);
    Qi(13) = N(4) * F(1);
    Qi(14) = N(4) * F(2);
    Qi(15) = N(5) * F(0);
    Qi(16) = N(5) * F(1);
    Qi(17) = N(5) * F(2);
    Qi(18) = N(6) * F(0);
    Qi(19) = N(6) * F(1);
    Qi(20) = N(6) * F(2);
    Qi(21) = N(7) * F(0);
    Qi(22) = N(7) * F(1);
    Qi(23) = N(7) * F(2);
    Qi(24) = N(8) * F(0);
    Qi(25) = N(8) * F(1);
    Qi(26) = N(8) * F(2);
    Qi(27) = N(9) * F(0);
    Qi(28) = N(9) * F(1);
    Qi(29) = N(9) * F(2);
    Qi(30) = N(10) * F(0);
    Qi(31) = N(10) * F(1);
    Qi(32) = N(10) * F(2);
    Qi(33) = N(11) * F(0);
    Qi(34) = N(11) * F(1);
    Qi(35) = N(11) * F(2);
    Qi(36) = N(12) * F(0);
    Qi(37) = N(12) * F(1);
    Qi(38) = N(12) * F(2);
    Qi(39) = N(13) * F(0);
    Qi(40) = N(13) * F(1);
    Qi(41) = N(13) * F(2);
    Qi(42) = N(14) * F(0);
    Qi(43) = N(14) * F(1);
    Qi(44) = N(14) * F(2);
    Qi(45) = N(15) * F(0);
    Qi(46) = N(15) * F(1);
    Qi(47) = N(15) * F(2);
    Qi(48) = N(16) * F(0);
    Qi(49) = N(16) * F(1);
    Qi(50) = N(16) * F(2);
    Qi(51) = N(17) * F(0);
    Qi(52) = N(17) * F(1);
    Qi(53) = N(17) * F(2);
    Qi(54) = N(18) * F(0);
    Qi(55) = N(18) * F(1);
    Qi(56) = N(18) * F(2);
    Qi(57) = N(19) * F(0);
    Qi(58) = N(19) * F(1);
    Qi(59) = N(19) * F(2);
}